

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_ui.cpp
# Opt level: O0

void __thiscall UiWindowX11::_setupImage(UiWindowX11 *this,Image *image)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  byte *pbVar6;
  char *pcVar7;
  undefined8 uVar8;
  ImageTemplate<unsigned_char> *in_RSI;
  long in_RDI;
  int defaultScreen;
  uint8_t *imageXEnd_1;
  uint8_t *imageX_1;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  char *imageData;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  size_type in_stack_ffffffffffffff68;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined8 uVar9;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar10;
  byte *local_58;
  byte *local_38;
  char *local_30;
  byte *local_20;
  
  bVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RSI);
  if (!bVar3) {
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RSI);
    local_20 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RSI);
    pbVar6 = local_20 + *(int *)(in_RDI + 0x9c) * uVar5;
    local_30 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x10ff8b);
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RSI);
    if (uVar4 == '\x01') {
      for (; local_20 != pbVar6; local_20 = local_20 + uVar5) {
        local_38 = local_20;
        uVar1 = *(uint *)(in_RDI + 0x98);
        for (; local_38 != local_20 + uVar1; local_38 = local_38 + 1) {
          memset(local_30,(uint)*local_38,3);
          local_30[3] = '\0';
          local_30 = local_30 + 4;
        }
      }
    }
    else {
      uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RSI);
      if (uVar4 != '\x03') {
        uVar8 = __cxa_allocate_exception(0x28);
        imageException::imageException
                  ((imageException *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        __cxa_throw(uVar8,&imageException::typeinfo,imageException::~imageException);
      }
      for (; local_20 != pbVar6; local_20 = local_20 + uVar5) {
        local_58 = local_20;
        iVar2 = *(int *)(in_RDI + 0x98);
        for (; local_58 != local_20 + (uint)(iVar2 * 3); local_58 = local_58 + 3) {
          *(undefined2 *)local_30 = *(undefined2 *)local_58;
          local_30[2] = local_58[2];
          local_30[3] = '\0';
          local_30 = local_30 + 4;
        }
      }
    }
    iVar2 = *(int *)(*(long *)(in_RDI + 0x70) + 0xe0);
    uVar8 = *(undefined8 *)(in_RDI + 0x70);
    uVar9 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x70) + 0xe8) + (long)iVar2 * 0x80 + 0x40);
    uVar10 = *(undefined4 *)(*(long *)(*(long *)(in_RDI + 0x70) + 0xe8) + (long)iVar2 * 0x80 + 0x38)
    ;
    pcVar7 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x11022c);
    uVar8 = XCreateImage(uVar8,uVar9,uVar10,2,0,pcVar7,*(undefined4 *)(in_RDI + 0x98),
                         *(undefined4 *)(in_RDI + 0x9c),0x20,0);
    *(undefined8 *)(in_RDI + 0x88) = uVar8;
  }
  return;
}

Assistant:

void UiWindowX11::_setupImage( const PenguinV_Image::Image & image )
{
    if ( image.empty() )
        return;

    _data.resize( _width * _height * 4 );
    const uint32_t rowSize = image.rowSize();

    const uint8_t * imageY = image.data();
    const uint8_t * imageYEnd = imageY + _height * rowSize;
    char * imageData = _data.data();

    if ( image.colorCount() == PenguinV_Image::GRAY_SCALE ) {
        for ( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + _width;

            for ( ; imageX != imageXEnd; ++imageX ) {
                memset( imageData, *imageX, 3u );
                imageData += 3;
                *imageData = 0;
                ++imageData;
            }
        }
    }
    else {
        if ( image.colorCount() != PenguinV_Image::RGB )
            throw imageException( "Color image has different than 3 color channels." );
        for ( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + _width * 3u;

            for ( ; imageX != imageXEnd; imageX += 3 ) {
                memcpy( imageData, imageX, 3u );
                imageData += 3;
                *imageData = 0;
                ++imageData;
            }
        }
    }

    const int defaultScreen = DefaultScreen( _uiDisplay );
    _image = XCreateImage( _uiDisplay, DefaultVisual( _uiDisplay, defaultScreen ), DefaultDepth( _uiDisplay, defaultScreen ), ZPixmap,
                           0, _data.data(), _width, _height, 32, 0 );
}